

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O2

int __thiscall gl4cts::PostDepthShaderCase::init(PostDepthShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_post_depth_coverage")
  ;
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->m_vertShader);
    std::__cxx11::string::assign((char *)&this->m_fragShader1);
    std::__cxx11::string::assign((char *)&this->m_fragShader2);
    std::__cxx11::string::assign((char *)&this->m_fragShader3);
    iVar2 = std::__cxx11::string::assign((char *)&this->m_fragShader4);
    return iVar2;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_ARB_post_depth_coverage not supported",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PostDepthShaderCase::init()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_post_depth_coverage"))
		throw tcu::NotSupportedError("GL_ARB_post_depth_coverage not supported");

	m_vertShader = c_commonVertShader;

	m_fragShader1 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : require\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader2 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"#ifndef GL_ARB_post_depth_coverage\n"
					"  #error GL_ARB_post_depth_coverage not defined\n"
					"#else\n"
					"  #if (GL_ARB_post_depth_coverage != 1)\n"
					"    #error GL_ARB_post_depth_coverage wrong defined\n"
					"  #endif\n"
					"#endif // GL_ARB_post_depth_coverage\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader3 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(early_fragment_tests) in;\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader4 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";
}